

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

QRgbaFloat<float> *
qt_fetch_linear_gradient_template<GradientBaseFP,QRgbaFloat<float>>
          (QRgbaFloat<float> *buffer,Operator *op,QSpanData *data,int y,int x,int length)

{
  long lVar1;
  Type fill;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int __x;
  QRgbaFloat<float> *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  Type TVar3;
  qreal y_1;
  qreal x_1;
  qreal rw;
  int inc_fixed;
  int t_fixed;
  QRgbaFloat<float> *end;
  qreal ry;
  qreal rx;
  bool affine;
  qreal inc;
  qreal t;
  QRgbaFloat<float> *b;
  QGradientData *in_stack_ffffffffffffff08;
  Type *in_stack_ffffffffffffff10;
  QRgbaFloat<float> *pQVar4;
  undefined7 in_stack_ffffffffffffff20;
  byte in_stack_ffffffffffffff27;
  undefined8 in_stack_ffffffffffffff28;
  double local_c8;
  byte local_79;
  double local_78;
  QRgbaFloat<float> *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  QRgbaFloat<float> *pQVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_79 = 1;
  if ((*(double *)(in_RSI + 0x90) != 0.0) || (NAN(*(double *)(in_RSI + 0x90)))) {
    local_78 = *(double *)(in_RSI + 0x80) * *(double *)(in_RDX + 0x38) +
               *(double *)(in_RSI + 0x88) * *(double *)(in_RDX + 0x40);
    in_stack_ffffffffffffff27 = 0;
    if ((*(double *)(in_RDX + 0x48) == 0.0) && (!NAN(*(double *)(in_RDX + 0x48)))) {
      in_stack_ffffffffffffff27 = *(double *)(in_RDX + 0x60) != 0.0 ^ 0xff;
    }
    local_79 = in_stack_ffffffffffffff27 & 1;
    if (local_79 != 0) {
      local_78 = local_78 * 1023.0;
    }
  }
  else {
    local_78 = 0.0;
  }
  pQVar4 = in_RDI + in_R9D;
  local_40 = in_RDI;
  if (local_79 == 0) {
    local_c8 = *(double *)(in_RDX + 0x60) * ((double)in_ECX + 0.5) +
               *(double *)(in_RDX + 0x48) * ((double)in_R8D + 0.5) + *(double *)(in_RDX + 0x68);
    for (; local_40 < pQVar4; local_40 = local_40 + 1) {
      TVar3 = GradientBaseFP::fetchSingle(in_stack_ffffffffffffff08,5.85093980254234e-317);
      local_38 = TVar3._0_8_;
      local_40->r = (float)(undefined4)local_38;
      local_40->g = (float)local_38._4_4_;
      local_30 = TVar3._8_8_;
      local_40->b = (float)(undefined4)local_30;
      local_40->a = (float)local_30._4_4_;
      local_c8 = *(double *)(in_RDX + 0x48) + local_c8;
      if ((local_c8 == 0.0) && (!NAN(local_c8))) {
        local_c8 = *(double *)(in_RDX + 0x48) + local_c8;
      }
    }
  }
  else if ((local_78 <= -1e-05) || (1e-05 <= local_78)) {
    pQVar2 = in_RDI;
    std::abs((int)in_RDI);
    __x = (int)pQVar2;
    if ((4194303.0 <= extraout_XMM0_Qa_00) ||
       ((std::abs(__x), 4194303.0 <= extraout_XMM0_Qa_01 ||
        (std::abs(__x), 4194303.0 <= extraout_XMM0_Qa_02)))) {
      for (; local_40 < pQVar4; local_40 = local_40 + 1) {
        TVar3 = GradientBaseFP::fetchSingle(in_stack_ffffffffffffff08,5.85075699825338e-317);
        local_28 = TVar3._0_8_;
        local_40->r = (float)(undefined4)local_28;
        local_40->g = (float)local_28._4_4_;
        local_20 = TVar3._8_8_;
        local_40->b = (float)(undefined4)local_20;
        local_40->a = (float)local_20._4_4_;
      }
    }
    else {
      for (; local_40 < pQVar4; local_40 = local_40 + 1) {
        TVar3 = GradientBaseFP::fetchSingle(in_stack_ffffffffffffff08,0);
        local_18 = TVar3._0_8_;
        local_40->r = (float)(undefined4)local_18;
        local_40->g = (float)local_18._4_4_;
        local_10 = TVar3._8_8_;
        local_40->b = (float)(undefined4)local_10;
        local_40->a = (float)local_10._4_4_;
      }
    }
  }
  else {
    std::abs((int)in_RDI);
    if (4194303.0 <= extraout_XMM0_Qa) {
      pQVar4 = in_RDI;
      GradientBaseFP::fetchSingle(in_stack_ffffffffffffff08,5.85055146694471e-317);
      TVar3.g._3_1_ = in_stack_ffffffffffffff27;
      TVar3._0_7_ = in_stack_ffffffffffffff20;
      TVar3.b = (float)(int)in_stack_ffffffffffffff28;
      TVar3.a = (float)(int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      GradientBaseFP::memfill(pQVar4,TVar3,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    }
    else {
      GradientBaseFP::fetchSingle(in_stack_ffffffffffffff08,0);
      fill.g._3_1_ = in_stack_ffffffffffffff27;
      fill._0_7_ = in_stack_ffffffffffffff20;
      fill.b = (float)(int)in_stack_ffffffffffffff28;
      fill.a = (float)(int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      GradientBaseFP::memfill
                (in_stack_ffffffffffffff10,fill,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static inline const BlendType * QT_FASTCALL qt_fetch_linear_gradient_template(
        BlendType *buffer, const Operator *op, const QSpanData *data,
        int y, int x, int length)
{
    const BlendType *b = buffer;
    qreal t, inc;

    bool affine = true;
    qreal rx=0, ry=0;
    if (op->linear.l == 0) {
        t = inc = 0;
    } else {
        rx = data->m21 * (y + qreal(0.5)) + data->m11 * (x + qreal(0.5)) + data->dx;
        ry = data->m22 * (y + qreal(0.5)) + data->m12 * (x + qreal(0.5)) + data->dy;
        t = op->linear.dx*rx + op->linear.dy*ry + op->linear.off;
        inc = op->linear.dx * data->m11 + op->linear.dy * data->m12;
        affine = !data->m13 && !data->m23;

        if (affine) {
            t *= (GRADIENT_STOPTABLE_SIZE - 1);
            inc *= (GRADIENT_STOPTABLE_SIZE - 1);
        }
    }

    const BlendType *end = buffer + length;
    if (affine) {
        if (inc > qreal(-1e-5) && inc < qreal(1e-5)) {
            if (std::abs(t) < FIXPT_MAX)
                GradientBase::memfill(buffer, GradientBase::fetchSingle(data->gradient, int(t * FIXPT_SIZE)), length);
            else
                GradientBase::memfill(buffer, GradientBase::fetchSingle(data->gradient, t / GRADIENT_STOPTABLE_SIZE), length);
        } else {
            if (std::abs(t) < FIXPT_MAX && std::abs(inc) < FIXPT_MAX && std::abs(t + inc * length) < FIXPT_MAX) {
                // we can use fixed point math
                int t_fixed = int(t * FIXPT_SIZE);
                int inc_fixed = int(inc * FIXPT_SIZE);
                while (buffer < end) {
                    *buffer = GradientBase::fetchSingle(data->gradient, t_fixed);
                    t_fixed += inc_fixed;
                    ++buffer;
                }
            } else {
                // we have to fall back to float math
                while (buffer < end) {
                    *buffer = GradientBase::fetchSingle(data->gradient, t/GRADIENT_STOPTABLE_SIZE);
                    t += inc;
                    ++buffer;
                }
            }
        }
    } else { // fall back to float math here as well
        qreal rw = data->m23 * (y + qreal(0.5)) + data->m13 * (x + qreal(0.5)) + data->m33;
        while (buffer < end) {
            qreal x = rx/rw;
            qreal y = ry/rw;
            t = (op->linear.dx*x + op->linear.dy *y) + op->linear.off;

            *buffer = GradientBase::fetchSingle(data->gradient, t);
            rx += data->m11;
            ry += data->m12;
            rw += data->m13;
            if (!rw) {
                rw += data->m13;
            }
            ++buffer;
        }
    }

    return b;
}